

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O0

FT_Error tt_glyph_load(FT_GlyphSlot ttslot,FT_Size ttsize,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Face pFVar1;
  uint uVar2;
  FT_Face local_50;
  FT_Error error;
  FT_Face face;
  TT_Size size;
  TT_GlyphSlot slot;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Size ttsize_local;
  FT_GlyphSlot ttslot_local;
  
  pFVar1 = ttslot->face;
  if (ttslot == (FT_GlyphSlot)0x0) {
    ttslot_local._4_4_ = 0x25;
  }
  else if (ttsize == (FT_Size)0x0) {
    ttslot_local._4_4_ = 0x24;
  }
  else if (pFVar1 == (FT_Face)0x0) {
    ttslot_local._4_4_ = 0x23;
  }
  else if ((glyph_index < (uint)pFVar1->num_glyphs) ||
          (pFVar1->internal->incremental_interface != (FT_Incremental_InterfaceRec *)0x0)) {
    slot._0_4_ = load_flags;
    if ((load_flags & 2U) != 0) {
      if ((pFVar1->face_flags & 0x2000U) != 0) {
        slot._0_4_ = load_flags & 0xfffffffd;
      }
      if (((uint)slot & 0x8000) != 0) {
        slot._0_4_ = (uint)slot | 2;
      }
    }
    uVar2 = (uint)slot;
    if ((((uint)slot & 0x401) != 0) && (uVar2 = (uint)slot | 9, (pFVar1->face_flags & 0x2000U) == 0)
       ) {
      uVar2 = (uint)slot | 0xb;
    }
    slot._0_4_ = uVar2;
    if (((uint)slot & 2) == 0) {
      local_50 = (FT_Face)&ttsize[1].generic;
    }
    else {
      local_50 = (FT_Face)&ttsize->metrics;
    }
    ttsize[1].face = local_50;
    ttslot_local._4_4_ = TT_Load_Glyph((TT_Size)ttsize,ttslot,glyph_index,(uint)slot);
  }
  else {
    ttslot_local._4_4_ = 6;
  }
  return ttslot_local._4_4_;
}

Assistant:

static FT_Error
  tt_glyph_load( FT_GlyphSlot  ttslot,      /* TT_GlyphSlot */
                 FT_Size       ttsize,      /* TT_Size      */
                 FT_UInt       glyph_index,
                 FT_Int32      load_flags )
  {
    TT_GlyphSlot  slot = (TT_GlyphSlot)ttslot;
    TT_Size       size = (TT_Size)ttsize;
    FT_Face       face = ttslot->face;
    FT_Error      error;


    if ( !slot )
      return FT_THROW( Invalid_Slot_Handle );

    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_index >= (FT_UInt)face->num_glyphs &&
         !face->internal->incremental_interface   )
#else
    if ( glyph_index >= (FT_UInt)face->num_glyphs )
#endif
      return FT_THROW( Invalid_Argument );

    if ( load_flags & FT_LOAD_NO_HINTING )
    {
      /* both FT_LOAD_NO_HINTING and FT_LOAD_NO_AUTOHINT   */
      /* are necessary to disable hinting for tricky fonts */

      if ( FT_IS_TRICKY( face ) )
        load_flags &= ~FT_LOAD_NO_HINTING;

      if ( load_flags & FT_LOAD_NO_AUTOHINT )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    if ( load_flags & ( FT_LOAD_NO_RECURSE | FT_LOAD_NO_SCALE ) )
    {
      load_flags |= FT_LOAD_NO_BITMAP | FT_LOAD_NO_SCALE;

      if ( !FT_IS_TRICKY( face ) )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    /* use hinted metrics only if we load a glyph with hinting */
    size->metrics = ( load_flags & FT_LOAD_NO_HINTING )
                      ? &ttsize->metrics
                      : &size->hinted_metrics;

    /* now fill in the glyph slot with outline/bitmap/layered */
    error = TT_Load_Glyph( size, slot, glyph_index, load_flags );

    /* force drop-out mode to 2 - irrelevant now */
    /* slot->outline.dropout_mode = 2; */

    return error;
  }